

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O0

int * Ndr_ObjReadBodyP(Ndr_Data_t *p,int Obj,int Type)

{
  int iVar1;
  int *piVar2;
  int local_24;
  int Ent;
  int Type_local;
  int Obj_local;
  Ndr_Data_t *p_local;
  
  local_24 = Obj + 1;
  while( true ) {
    iVar1 = Ndr_DataEnd(p,Obj);
    if (iVar1 <= local_24) {
      return (int *)0x0;
    }
    iVar1 = Ndr_DataType(p,local_24);
    if (iVar1 == Type) break;
    iVar1 = Ndr_DataSize(p,local_24);
    local_24 = iVar1 + local_24;
  }
  piVar2 = Ndr_DataEntryP(p,local_24);
  return piVar2;
}

Assistant:

static inline int * Ndr_ObjReadBodyP( Ndr_Data_t * p, int Obj, int Type )
{
    int Ent;
    Ndr_ObjForEachEntry( p, Obj, Ent )
        if ( Ndr_DataType(p, Ent) == Type )
            return Ndr_DataEntryP(p, Ent);
    return NULL;
}